

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O1

void __thiscall
asio::basic_socket<asio::ip::tcp,asio::any_io_executor>::initiate_async_connect::operator()
          (initiate_async_connect *this,function<void_(const_std::error_code_&)> *handler,
          endpoint_type *peer_endpoint,error_code *open_ec)

{
  long lVar1;
  undefined8 *puVar2;
  non_const_lvalue<std::function<void_(const_std::error_code_&)>_&> handler2;
  _Any_data _Stack_88;
  code *local_78;
  undefined8 *local_70;
  long local_68;
  undefined8 local_58;
  _Any_data local_50;
  code *local_40;
  undefined8 local_30;
  error_category *peStack_28;
  
  if (open_ec->_M_value == 0) {
    std::function<void_(const_std::error_code_&)>::function
              ((function<void_(const_std::error_code_&)> *)&_Stack_88,handler);
    puVar2 = *(undefined8 **)this;
    detail::reactive_socket_service<asio::ip::tcp>::
    async_connect<std::function<void(std::error_code_const&)>,asio::any_io_executor>
              ((reactive_socket_service<asio::ip::tcp> *)*puVar2,(implementation_type *)(puVar2 + 1)
               ,peer_endpoint,(function<void_(const_std::error_code_&)> *)&_Stack_88,
               (any_io_executor *)(puVar2 + 4));
    if (local_78 != (code *)0x0) {
      (*local_78)(&_Stack_88,&_Stack_88,__destroy_functor);
    }
  }
  else {
    lVar1 = *(long *)this;
    std::function<void_(const_std::error_code_&)>::function
              ((function<void_(const_std::error_code_&)> *)&local_50,handler);
    local_30 = *(undefined8 *)open_ec;
    peStack_28 = open_ec->_M_cat;
    execution::detail::any_executor_base::any_executor_base
              ((any_executor_base *)&_Stack_88,(any_executor_base *)(lVar1 + 0x20));
    local_58 = *(undefined8 *)(lVar1 + 0x50);
    detail::initiate_post_with_executor<asio::any_io_executor>::operator()
              ((initiate_post_with_executor<asio::any_io_executor> *)&_Stack_88,
               (binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> *)&local_50,
               (enable_if_t<execution::is_executor<conditional_t<true,_executor_type,_binder1<function<void_(const_error_code_&)>,_error_code>_>_>::value>
                *)0x0,(enable_if_t<_detail::is_work_dispatcher_required<decay_t<binder1<function<void_(const_error_code_&)>,_error_code>_>,_any_io_executor>::value>
                       *)0x0);
    if (local_68 != 0) {
      (*(code *)*local_70)((any_executor_base *)&_Stack_88);
    }
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
  }
  return;
}

Assistant:

void operator()(ConnectHandler&& handler,
        const endpoint_type& peer_endpoint,
        const asio::error_code& open_ec) const
    {
      // If you get an error on the following line it means that your handler
      // does not meet the documented type requirements for a ConnectHandler.
      ASIO_CONNECT_HANDLER_CHECK(ConnectHandler, handler) type_check;

      if (open_ec)
      {
          asio::post(self_->impl_.get_executor(),
              asio::detail::bind_handler(
                static_cast<ConnectHandler&&>(handler), open_ec));
      }
      else
      {
        detail::non_const_lvalue<ConnectHandler> handler2(handler);
        self_->impl_.get_service().async_connect(
            self_->impl_.get_implementation(), peer_endpoint,
            handler2.value, self_->impl_.get_executor());
      }
    }